

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool close_connection,bool *connection_closed,
          function<void_(httplib::Request_&)> *setup_request)

{
  _Rb_tree_header *p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *p_Var2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  _Var3;
  Stream *pSVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int extraout_var;
  iterator iVar9;
  _Base_ptr p_Var10;
  _Alloc_hider _Var11;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *p_Var12;
  const_iterator cVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  char *pcVar17;
  uint __val;
  uint __len;
  long lVar18;
  uint uVar19;
  undefined1 **ppuVar20;
  bool bVar21;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar22;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar23;
  Headers dummy;
  int status;
  Request req;
  array<char,_2048UL> buf;
  undefined1 local_c30 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c20;
  _Base_ptr local_c10;
  size_t local_c08;
  Stream *local_c00;
  bool *local_bf8;
  _Any_data *local_bf0;
  long *local_be8 [2];
  long local_bd8 [2];
  Stream *local_bc8;
  undefined1 *local_bc0;
  long local_bb8;
  ulong local_bb0;
  undefined1 *local_ba8;
  ulong local_ba0;
  undefined1 local_b98;
  undefined7 uStack_b97;
  string local_b88;
  undefined1 local_b68 [80];
  _Rb_tree_node_base local_b18;
  size_t local_af8;
  _Alloc_hider local_af0;
  size_type local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ae0;
  _Alloc_hider local_ad0;
  size_type local_ac8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac0;
  size_t local_ab0;
  _Any_data _Stack_aa8;
  _Manager_type p_Stack_a98;
  _Invoker_type local_a90;
  _Any_data _Stack_a88;
  undefined2 uStack_a78;
  undefined6 uStack_a76;
  undefined2 uStack_a70;
  undefined8 uStack_a6e;
  undefined1 local_a60 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a20;
  _Alloc_hider local_9f0;
  size_type local_9e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  uint local_9b0 [2];
  _Alloc_hider local_9a8;
  size_type local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  _Alloc_hider local_988;
  size_type local_980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_978;
  _Rb_tree_node_base local_960;
  size_t local_940;
  _Rb_tree_node_base local_930;
  undefined1 local_910 [8];
  Ranges local_908 [6];
  size_t local_870;
  size_t local_868;
  _Any_data _Stack_860;
  undefined1 uStack_850;
  undefined7 uStack_84f;
  undefined1 uStack_848;
  undefined8 uStack_847;
  size_t local_838;
  undefined1 local_830 [2048];
  
  lVar18 = 0;
  local_bf8 = connection_closed;
  local_bf0 = (_Any_data *)setup_request;
  memset(local_830,0,0x800);
  local_bb8 = 0x800;
  local_bb0 = 0;
  local_ba8 = &local_b98;
  local_ba0 = 0;
  local_b98 = 0;
  local_bc8 = strm;
  local_bc0 = local_830;
  do {
    iVar7 = (*local_bc8->_vptr_Stream[4])(local_bc8,local_a60,1);
    if (extraout_var < 0) {
      bVar21 = false;
      bVar6 = false;
    }
    else if (CONCAT44(extraout_var,iVar7) == 0) {
      bVar6 = lVar18 != 0;
      bVar21 = false;
    }
    else {
      if (local_bb0 < local_bb8 - 1U) {
        local_bc0[local_bb0] = local_a60[0];
        local_bc0[local_bb0 + 1] = 0;
        local_bb0 = local_bb0 + 1;
      }
      else {
        if (local_ba0 == 0) {
          if (local_bc0[local_bb0] != '\0') {
            __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                          ,0x8a8,"void httplib::detail::stream_line_reader::append(char)");
          }
          std::__cxx11::string::_M_replace((ulong)&local_ba8,0,(char *)0x0,(ulong)local_bc0);
        }
        std::__cxx11::string::push_back((char)&local_ba8);
      }
      bVar21 = local_a60[0] != '\n';
      bVar6 = true;
    }
    lVar18 = lVar18 + -1;
  } while (bVar21);
  bVar5 = 0;
  if (!bVar6) goto LAB_0013ea9e;
  local_a60._0_8_ = local_a60 + 0x10;
  local_a60._8_8_ = 0;
  local_a60[0x10] = '\0';
  local_a60._32_8_ = local_a60 + 0x30;
  local_a60._40_8_ = 0;
  local_a60[0x30] = '\0';
  local_a20._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a20._M_impl.super__Rb_tree_header._M_header;
  local_a20._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a20._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a20._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_9f0._M_p = (pointer)&local_9e0;
  local_9e8 = 0;
  local_9e0._M_local_buf[0] = '\0';
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  local_9d0._M_string_length = 0;
  local_9d0.field_2._M_local_buf[0] = '\0';
  local_9b0[0] = 0xffffffff;
  local_9a8._M_p = (pointer)&local_998;
  local_9a0 = 0;
  local_998._M_local_buf[0] = '\0';
  local_988._M_p = (pointer)&local_978;
  local_980 = 0;
  local_978._M_local_buf[0] = '\0';
  local_960._M_left = &local_960;
  local_960._M_color = _S_red;
  local_960._M_parent = (_Base_ptr)0x0;
  local_940 = 0;
  local_930._M_left = &local_930;
  local_930._M_color = _S_red;
  local_930._M_parent = (_Base_ptr)0x0;
  local_a20._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a20._M_impl.super__Rb_tree_header._M_header._M_left;
  local_960._M_right = local_960._M_left;
  local_930._M_right = local_930._M_left;
  memset(local_910,0,0xa0);
  local_870 = 0x14;
  local_838 = 0;
  local_868 = 0;
  _Stack_860._M_unused._M_object = (void *)0x0;
  _Stack_860._8_8_ = 0;
  uStack_850 = 0;
  uStack_84f = 0;
  uStack_848 = 0;
  uStack_847 = 0;
  local_b68._0_8_ = local_b68 + 0x10;
  local_b68._8_8_ = 0;
  local_b68[0x10] = '\0';
  local_b68._32_4_ = -1;
  local_b68._40_8_ = local_b68 + 0x38;
  local_b68._48_8_ = 0;
  local_b68[0x38] = '\0';
  local_b18._M_color = _S_red;
  local_b18._M_parent = (_Base_ptr)0x0;
  local_af8 = 0;
  local_af0._M_p = (pointer)&local_ae0;
  local_ae8 = 0;
  local_ae0._M_local_buf[0] = '\0';
  local_ad0._M_p = (pointer)&local_ac0;
  local_ac8 = 0;
  local_ac0._M_local_buf[0] = '\0';
  local_ab0 = 0;
  _Stack_aa8._M_unused._M_object = (void *)0x0;
  _Stack_aa8._8_8_ = 0;
  p_Stack_a98 = (_Manager_type)0x0;
  local_a90 = (_Invoker_type)0x0;
  _Stack_a88._M_unused._M_object = (void *)0x0;
  _Stack_a88._8_8_ = 0;
  uStack_a78 = 0;
  uStack_a76 = 0;
  uStack_a70 = 0;
  uStack_a6e = 0;
  local_b18._M_left = &local_b18;
  local_b18._M_right = &local_b18;
  std::__cxx11::string::_M_replace((ulong)local_b68,0,(char *)0x0,0x1532d9);
  p_Var10 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
  local_c00 = strm;
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    p_Var2 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(local_b68 + 0x48);
    do {
      __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(p_Var10 + 1);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)p_Var2,(key_type *)__v);
      if (iVar9._M_node == &local_b18) {
        pVar22 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::_M_get_insert_equal_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)p_Var2,(key_type *)__v);
        local_c30._0_8_ = p_Var2;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                  (p_Var2,pVar22.first,pVar22.second,__v,(_Alloc_node *)local_c30);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  pSVar4 = local_c00;
  iVar7 = (*local_c00->_vptr_Stream[7])(local_c00);
  if (iVar7 < 0x400) {
    uVar15 = local_ba0;
    if (local_ba0 == 0) {
      uVar15 = local_bb0;
    }
    if (0x2000 < uVar15) {
      local_c20._8_8_ = local_c30 + 8;
      local_c30._8_4_ = _S_red;
      local_c20._M_allocated_capacity = 0;
      local_c08 = 0;
      local_c10 = (_Base_ptr)local_c20._8_8_;
      detail::read_headers(pSVar4,(Headers *)local_c30);
      local_b68._32_4_ = 0x19e;
      bVar5 = write_response_core(this,pSVar4,close_connection,(Request *)local_a60,
                                  (Response *)local_b68,false);
      goto LAB_0013e9a6;
    }
    ppuVar20 = &local_ba8;
    if (local_ba0 == 0) {
      ppuVar20 = &local_bc0;
    }
    bVar21 = parse_request_line(this,*ppuVar20,(Request *)local_a60);
    if (bVar21) {
      bVar21 = detail::read_headers(pSVar4,(Headers *)&local_a20);
      if (!bVar21) goto LAB_0013ea54;
      p_Var2 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)(local_c30 + 0x10);
      local_c30._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"Connection","");
      pVar23 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&local_a20,(key_type *)local_c30);
      if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *)local_c30._0_8_ != p_Var2) {
        operator_delete((void *)local_c30._0_8_,(ulong)(local_c20._M_allocated_capacity + 1));
      }
      if (pVar23.first._M_node._M_node == pVar23.second._M_node._M_node) {
        pcVar17 = "";
      }
      else {
        pcVar17 = *(char **)(pVar23.first._M_node._M_node + 2);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b88,pcVar17,(allocator<char> *)local_c30);
      iVar7 = std::__cxx11::string::compare((char *)&local_b88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
        operator_delete(local_b88._M_dataplus._M_p,local_b88.field_2._M_allocated_capacity + 1);
      }
      if (iVar7 == 0) {
        *local_bf8 = true;
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_9a8);
      if (iVar7 == 0) {
        Request::get_header_value_abi_cxx11_(&local_b88,(Request *)local_a60,"Connection",0);
        iVar8 = std::__cxx11::string::compare((char *)&local_b88);
        bVar21 = iVar8 != 0;
      }
      else {
        bVar21 = false;
      }
      pSVar4 = local_c00;
      if ((iVar7 == 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b88._M_dataplus._M_p != &local_b88.field_2)) {
        operator_delete(local_b88._M_dataplus._M_p,local_b88.field_2._M_allocated_capacity + 1);
      }
      if (bVar21) {
        *local_bf8 = true;
      }
      (*pSVar4->_vptr_Stream[6])(pSVar4,&local_9d0,local_9b0);
      local_c30._0_8_ = "REMOTE_ADDR";
      cVar16 = 'R';
      bVar21 = true;
      lVar18 = 1;
      do {
        if ((cVar16 == '\n') || (cVar16 == '\r')) break;
        cVar16 = "REMOTE_ADDR"[lVar18];
        bVar21 = cVar16 != '\0';
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xc);
      if (!bVar21) {
        cVar16 = *local_9d0._M_dataplus._M_p;
        _Var11._M_p = local_9d0._M_dataplus._M_p;
        while (((cVar16 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar16 != '\n')) &&
               (cVar16 != '\r'))) {
          cVar16 = *_Var11._M_p;
        }
        if (cVar16 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&local_a20,(char **)local_c30,&local_9d0);
        }
      }
      __val = -local_9b0[0];
      if (0 < (int)local_9b0[0]) {
        __val = local_9b0[0];
      }
      __len = 1;
      if (9 < __val) {
        uVar15 = (ulong)__val;
        uVar19 = 4;
        do {
          __len = uVar19;
          uVar14 = (uint)uVar15;
          if (uVar14 < 100) {
            __len = __len - 2;
            goto LAB_0013ecd3;
          }
          if (uVar14 < 1000) {
            __len = __len - 1;
            goto LAB_0013ecd3;
          }
          if (uVar14 < 10000) goto LAB_0013ecd3;
          uVar15 = uVar15 / 10000;
          uVar19 = __len + 4;
        } while (99999 < uVar14);
        __len = __len + 1;
      }
LAB_0013ecd3:
      uVar19 = local_9b0[0] >> 0x1f;
      local_c30._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct
                ((ulong)local_c30,(char)__len - (char)((int)local_9b0[0] >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_c30._0_8_ + (ulong)uVar19),__len,__val);
      local_be8[0] = (long *)0x1532f9;
      cVar16 = 'R';
      bVar21 = true;
      lVar18 = 1;
      do {
        if ((cVar16 == '\n') || (cVar16 == '\r')) break;
        cVar16 = "REMOTE_PORT"[lVar18];
        bVar21 = cVar16 != '\0';
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xc);
      if (!bVar21) {
        _Var3 = *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_c30._0_8_;
        p_Var12 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   *)local_c30._0_8_;
        while (((_Var3 != (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           )0x0 &&
                (p_Var12 = p_Var12 + 1,
                _Var3 != (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          )0xa)) &&
               (_Var3 != (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          )0xd))) {
          _Var3 = *p_Var12;
        }
        if (_Var3 == (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      )0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&local_a20,(char **)local_be8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c30)
          ;
        }
      }
      if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *)local_c30._0_8_ != p_Var2) {
        operator_delete((void *)local_c30._0_8_,(ulong)(local_c20._M_allocated_capacity + 1));
      }
      local_c30._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"Range","");
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&local_a20,(key_type *)local_c30);
      if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *)local_c30._0_8_ != p_Var2) {
        operator_delete((void *)local_c30._0_8_,(ulong)(local_c20._M_allocated_capacity + 1));
      }
      if ((_Rb_tree_header *)cVar13._M_node == &local_a20._M_impl.super__Rb_tree_header) {
LAB_0013ee77:
        bVar5 = (byte)__val;
        if (*(long *)(local_bf0 + 1) != 0) {
          (**(code **)((long)local_bf0 + 0x18))(local_bf0,(Request *)local_a60);
        }
        local_c30._0_8_ = p_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"Expect","");
        pVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::equal_range(&local_a20,(key_type *)local_c30);
        if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)local_c30._0_8_ != p_Var2) {
          operator_delete((void *)local_c30._0_8_,(ulong)(local_c20._M_allocated_capacity + 1));
        }
        if (pVar23.first._M_node._M_node == pVar23.second._M_node._M_node) {
          pcVar17 = "";
        }
        else {
          pcVar17 = *(char **)(pVar23.first._M_node._M_node + 2);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_be8,pcVar17,(allocator<char> *)local_c30);
        iVar7 = std::__cxx11::string::compare((char *)local_be8);
        if (local_be8[0] != local_bd8) {
          operator_delete(local_be8[0],local_bd8[0] + 1);
        }
        pSVar4 = local_c00;
        if (iVar7 == 0) {
          local_be8[0] = (long *)CONCAT44(local_be8[0]._4_4_,100);
          if ((this->expect_100_continue_handler_).super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            iVar7 = (*(this->expect_100_continue_handler_)._M_invoker)
                              ((_Any_data *)&this->expect_100_continue_handler_,(Request *)local_a60
                               ,(Response *)local_b68);
            local_be8[0] = (long *)CONCAT44(local_be8[0]._4_4_,iVar7);
          }
          if (((int)local_be8[0] == 0x1a1) || ((int)local_be8[0] == 100)) {
            local_c30._0_8_ = detail::status_message((int)local_be8[0]);
            Stream::write_format<int,char_const*>
                      (pSVar4,"HTTP/1.1 %d %s\r\n\r\n",(int *)local_be8,(char **)local_c30);
            bVar21 = true;
          }
          else {
            bVar21 = false;
            bVar5 = write_response_core(this,pSVar4,close_connection,(Request *)local_a60,
                                        (Response *)local_b68,false);
          }
          if (!bVar21) goto LAB_0013ea84;
        }
        bVar21 = routing(this,(Request *)local_a60,(Response *)local_b68,pSVar4);
        if (bVar21) {
          bVar21 = true;
          if (local_b68._32_4_ == -1) {
            local_b68._32_4_ = 0xce;
            if (local_908[0].
                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_908[0].
                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              local_b68._32_4_ = 200;
            }
            bVar21 = true;
          }
        }
        else {
          bVar21 = false;
          if (local_b68._32_4_ == -1) {
            local_b68._32_4_ = 0x194;
          }
        }
        bVar5 = write_response_core(this,local_c00,close_connection,(Request *)local_a60,
                                    (Response *)local_b68,bVar21);
      }
      else {
        Request::get_header_value_abi_cxx11_((string *)local_c30,(Request *)local_a60,"Range",0);
        bVar21 = detail::parse_range_header((string *)local_c30,local_908);
        if (!bVar21) {
          local_b68._32_4_ = 0x1a0;
          bVar6 = write_response_core(this,local_c00,close_connection,(Request *)local_a60,
                                      (Response *)local_b68,false);
          __val = (uint)bVar6;
        }
        bVar5 = (byte)__val;
        if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)local_c30._0_8_ != p_Var2) {
          operator_delete((void *)local_c30._0_8_,(ulong)(local_c20._M_allocated_capacity + 1));
        }
        if (bVar21) goto LAB_0013ee77;
      }
    }
    else {
LAB_0013ea54:
      local_b68._32_4_ = 400;
      bVar5 = write_response_core(this,pSVar4,close_connection,(Request *)local_a60,
                                  (Response *)local_b68,false);
    }
  }
  else {
    local_c20._8_8_ = local_c30 + 8;
    local_c30._8_4_ = _S_red;
    local_c20._M_allocated_capacity = 0;
    local_c08 = 0;
    local_c10 = (_Base_ptr)local_c20._8_8_;
    detail::read_headers(pSVar4,(Headers *)local_c30);
    local_b68._32_4_ = 500;
    bVar5 = write_response_core(this,pSVar4,close_connection,(Request *)local_a60,
                                (Response *)local_b68,false);
LAB_0013e9a6:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_c30);
  }
LAB_0013ea84:
  Response::~Response((Response *)local_b68);
  Request::~Request((Request *)local_a60);
LAB_0013ea9e:
  if (local_ba8 != &local_b98) {
    operator_delete(local_ba8,CONCAT71(uStack_b97,local_b98) + 1);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

inline bool
Server::process_request(Stream &strm, bool close_connection,
                        bool &connection_closed,
                        const std::function<void(Request &)> &setup_request) {
  std::array<char, 2048> buf{};

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  // Connection has been closed on client
  if (!line_reader.getline()) { return false; }

  Request req;
  Response res;

  res.version = "HTTP/1.1";

  for (const auto &header : default_headers_) {
    if (res.headers.find(header.first) == res.headers.end()) {
      res.headers.insert(header);
    }
  }

#ifdef _WIN32
  // TODO: Increase FD_SETSIZE statically (libzmq), dynamically (MySQL).
#else
#ifndef CPPHTTPLIB_USE_POLL
  // Socket file descriptor exceeded FD_SETSIZE...
  if (strm.socket() >= FD_SETSIZE) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 500;
    return write_response(strm, close_connection, req, res);
  }
#endif
#endif

  // Check if the request URI doesn't exceed the limit
  if (line_reader.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 414;
    return write_response(strm, close_connection, req, res);
  }

  // Request line and headers
  if (!parse_request_line(line_reader.ptr(), req) ||
      !detail::read_headers(strm, req.headers)) {
    res.status = 400;
    return write_response(strm, close_connection, req, res);
  }

  if (req.get_header_value("Connection") == "close") {
    connection_closed = true;
  }

  if (req.version == "HTTP/1.0" &&
      req.get_header_value("Connection") != "Keep-Alive") {
    connection_closed = true;
  }

  strm.get_remote_ip_and_port(req.remote_addr, req.remote_port);
  req.set_header("REMOTE_ADDR", req.remote_addr);
  req.set_header("REMOTE_PORT", std::to_string(req.remote_port));

  if (req.has_header("Range")) {
    const auto &range_header_value = req.get_header_value("Range");
    if (!detail::parse_range_header(range_header_value, req.ranges)) {
      res.status = 416;
      return write_response(strm, close_connection, req, res);
    }
  }

  if (setup_request) { setup_request(req); }

  if (req.get_header_value("Expect") == "100-continue") {
    auto status = 100;
    if (expect_100_continue_handler_) {
      status = expect_100_continue_handler_(req, res);
    }
    switch (status) {
    case 100:
    case 417:
      strm.write_format("HTTP/1.1 %d %s\r\n\r\n", status,
                        detail::status_message(status));
      break;
    default: return write_response(strm, close_connection, req, res);
    }
  }

  // Rounting
  bool routed = false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
  routed = routing(req, res, strm);
#else
  try {
    routed = routing(req, res, strm);
  } catch (std::exception &e) {
    if (exception_handler_) {
      exception_handler_(req, res, e);
      routed = true;
    } else {
      res.status = 500;
      res.set_header("EXCEPTION_WHAT", e.what());
    }
  } catch (...) {
    res.status = 500;
    res.set_header("EXCEPTION_WHAT", "UNKNOWN");
  }
#endif

  if (routed) {
    if (res.status == -1) { res.status = req.ranges.empty() ? 200 : 206; }
    return write_response_with_content(strm, close_connection, req, res);
  } else {
    if (res.status == -1) { res.status = 404; }
    return write_response(strm, close_connection, req, res);
  }
}